

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int invertroot(int q,double *ma)

{
  ulong uVar1;
  size_t sVar2;
  double dVar3;
  uint DEGREE;
  int iVar4;
  double *coeff;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  undefined8 *__ptr_00;
  undefined8 *__ptr_01;
  undefined8 *__ptr_02;
  undefined8 *__ptr_03;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 *__dest;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (q < 1) {
    uVar8 = 0xffffffff;
  }
  else {
    uVar9 = 0xffffffff;
    uVar6 = 0;
    do {
      if (ma[uVar6] != 0.0) {
        uVar9 = uVar6 & 0xffffffff;
      }
      if (NAN(ma[uVar6])) {
        uVar9 = uVar6 & 0xffffffff;
      }
      uVar8 = (uint)uVar9;
      uVar6 = uVar6 + 1;
    } while ((uint)q != uVar6);
  }
  if (uVar8 == 0xffffffff) {
    iVar5 = 0;
  }
  else {
    lVar10 = (long)q;
    coeff = (double *)malloc(lVar10 * 8 + 8);
    ZEROR = (double *)malloc(lVar10 * 8);
    ZEROI = (double *)malloc(lVar10 * 8);
    __ptr = malloc(lVar10 << 2);
    DEGREE = uVar8 + 1;
    uVar6 = (ulong)DEGREE;
    *coeff = 1.0;
    if (-1 < (int)uVar8) {
      memcpy(coeff + 1,ma,(ulong)uVar8 * 8 + 8);
    }
    sVar2 = (long)(int)uVar8 * 8 + 0x10;
    __ptr_00 = (undefined8 *)malloc(sVar2);
    __ptr_01 = (undefined8 *)malloc(sVar2);
    __ptr_02 = (undefined8 *)malloc(sVar2);
    __ptr_03 = (undefined8 *)malloc(sVar2);
    iVar4 = polyroot(coeff,DEGREE,ZEROR,ZEROI);
    iVar5 = 0;
    if ((iVar4 != 1) && (iVar5 = 0, -1 < (int)uVar8)) {
      uVar9 = 0;
      iVar5 = 0;
      do {
        dVar11 = ZEROR[uVar9];
        dVar13 = ZEROI[uVar9];
        *(undefined4 *)((long)__ptr + uVar9 * 4) = 0;
        if (dVar11 * dVar11 + dVar13 * dVar13 < 1.0) {
          *(undefined4 *)((long)__ptr + uVar9 * 4) = 1;
          iVar5 = iVar5 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else if (uVar8 == 0) {
        *ma = 1.0 / *ma;
        iVar5 = 1;
        if (1 < q) {
          memset(ma + 1,0,(ulong)(q - 1) << 3);
          iVar5 = 1;
        }
      }
      else {
        uVar9 = 0;
        do {
          if (*(int *)((long)__ptr + uVar9 * 4) == 1) {
            dVar11 = ZEROR[uVar9];
            dVar13 = ZEROI[uVar9];
            dVar12 = dVar11 * dVar11 + dVar13 * dVar13;
            ZEROR[uVar9] = dVar11 / dVar12;
            ZEROI[uVar9] = -dVar13 / dVar12;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        *__ptr_00 = 0x3ff0000000000000;
        *__ptr_01 = 0;
        *__ptr_02 = 0x3ff0000000000000;
        *__ptr_03 = 0;
        __dest = __ptr_00 + 1;
        uVar9 = 0;
        do {
          sVar2 = uVar9 * 8 + 8;
          uVar1 = uVar9 + 1;
          dVar11 = ZEROR[uVar9];
          dVar13 = ZEROI[uVar9];
          dVar12 = dVar11 * dVar11 + dVar13 * dVar13;
          dVar11 = dVar11 / dVar12;
          dVar12 = -dVar13 / dVar12;
          __ptr_01[uVar9 + 1] = 0;
          __ptr_00[uVar9 + 1] = 0;
          uVar7 = 0xffffffffffffffff;
          do {
            dVar13 = (double)__dest[uVar7];
            dVar3 = (double)(__ptr_01 + 1)[uVar7];
            dVar14 = dVar11 * dVar13 + dVar3 * -dVar12;
            __ptr_02[uVar7 + 2] = dVar14;
            dVar13 = dVar3 * dVar11 + dVar13 * dVar12;
            __ptr_03[uVar7 + 2] = dVar13;
            __ptr_02[uVar7 + 2] = (double)__ptr_00[uVar7 + 2] - dVar14;
            __ptr_03[uVar7 + 2] = (double)__ptr_01[uVar7 + 2] - dVar13;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
          memcpy(__dest,__ptr_02 + 1,sVar2);
          memcpy(__ptr_01 + 1,__ptr_03 + 1,sVar2);
          uVar9 = uVar1;
        } while (uVar1 != uVar6);
        memcpy(ma,__dest,(ulong)uVar8 * 8 + 8);
        if ((int)DEGREE < q) {
          memset(ma + (int)DEGREE,0,(ulong)((q - uVar8) - 2) * 8 + 8);
        }
        iVar5 = 1;
      }
    }
    free(ZEROR);
    free(ZEROI);
    free(coeff);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    free(__ptr_03);
  }
  return iVar5;
}

Assistant:

int invertroot(int q, double *ma) {
	int i, index, retval, fail, rcheck, qn, i1, j;
	double *temp, *zeror, *zeroi, *xr, *xi,*yr,*yi;
	int *ind;
	double mod,tempr,tempi;


	retval = 0;
	index = -1;
	for (i = 0; i < q; ++i) {
		if (ma[i] != 0.0) {
			index = i;
		}
	}

	if (index == -1) {
		return retval;
	}
	
	temp = (double*)malloc(sizeof(double)* (q + 1));
	zeror = (double*)malloc(sizeof(double)* q);
	zeroi = (double*)malloc(sizeof(double)* q);
	ind = (int*)malloc(sizeof(int)* q);

	index++;
	temp[0] = 1.0;
	for (i = 1; i <= index; ++i) {
		temp[i] = ma[i - 1];
	}

	qn = index;

	xr = (double*)malloc(sizeof(double)* (qn + 1));
	xi = (double*)malloc(sizeof(double)* (qn + 1));
	yr = (double*)malloc(sizeof(double)* (qn + 1));
	yi = (double*)malloc(sizeof(double)* (qn + 1));

	fail = polyroot(temp, qn, zeror, zeroi);

	//mdisplay(zeroi, 1, qn);

	if (fail == 1) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	rcheck = 0;

	for (i = 0; i < qn; ++i) {
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		ind[i] = 0;
		if (mod < 1.0) {
			ind[i] = 1;
			rcheck++;
		}
	}

	if (rcheck == 0) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}
	else {
		retval = 1;
	}

	if (index == 1) {
		ma[0] = 1.0 / ma[0];
		for (i = 1; i < q; ++i) {
			ma[i] = 0.0;
		}
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	for (i = 0; i < index; ++i) {
		if (ind[i] == 1) {
			mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
			zeror[i] = zeror[i] / mod;
			zeroi[i] = -zeroi[i] / mod;
		}
	}

	//mdisplay(zeroi, 1, qn);

	xr[0] = 1.0; xi[0] = 0.0;
	yr[0] = xr[0];
	yi[0] = xi[0];

	for (i = 0; i < qn; ++i) {
		i1 = i + 1;
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		tempr = zeror[i] / mod;
		tempi = -zeroi[i] / mod;
		xr[i1] = xi[i1] = 0.0;
		for (j = 1; j <= i1; ++j) {
			yr[j] = tempr * xr[j - 1] - tempi * xi[j - 1];
			yi[j] = tempr * xi[j - 1] + tempi * xr[j - 1];
			yr[j] = xr[j] - yr[j];
			yi[j] = xi[j] - yi[j];
		}
		for (j = 1; j <= i1; ++j) {
			xr[j] = yr[j];
			xi[j] = yi[j];
		}
		//mdisplay(xr, 1, qn+1);
	}

	for (i = 0; i < qn; ++i) {
		ma[i] = xr[i+1];
	}

	for (i = qn; i < q; ++i) {
		ma[i] = 0.0;
	}

	free(zeror);
	free(zeroi);
	free(temp);
	free(ind);
	free(xr);
	free(xi);
	free(yr);
	free(yi);
	return retval;
}